

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

natwm_error button_handle_resize_end(natwm_state *state,xcb_button_release_event_t *event)

{
  button_state *pbVar1;
  natwm_error nVar2;
  
  pbVar1 = state->button_state;
  nVar2 = NO_ERROR;
  if (pbVar1->grabbed_client != (client *)0x0) {
    nVar2 = client_handle_resize
                      (state,pbVar1->grabbed_client,event->event_x - pbVar1->start_x,
                       event->event_y - pbVar1->start_y);
    if (nVar2 == NO_ERROR) {
      hide_resize_helper(state);
      button_state_reset(state);
      nVar2 = NO_ERROR;
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to perform resize");
    }
  }
  return nVar2;
}

Assistant:

enum natwm_error button_handle_resize_end(struct natwm_state *state,
                                          const xcb_button_release_event_t *event)
{
        if (state->button_state->grabbed_client == NULL) {
                return NO_ERROR;
        }

        int16_t offset_x = (int16_t)(event->event_x - state->button_state->start_x);
        int16_t offset_y = (int16_t)(event->event_y - state->button_state->start_y);

        enum natwm_error err = client_handle_resize(
                state, state->button_state->grabbed_client, offset_x, offset_y);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to perform resize");

                return err;
        }

        hide_resize_helper(state);
        button_state_reset(state);

        return NO_ERROR;
}